

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::evaluateGradient
          (CostAttributes *this,double time,VectorDynSize *values,VectorDynSize *partialDerivative,
          string *label)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  element_type *peVar4;
  element_type *peVar5;
  double dVar6;
  bool bVar7;
  uint uVar8;
  Index size;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  PointerType pdVar14;
  PointerType pdVar15;
  ostream *poVar16;
  long lVar17;
  ulong uVar18;
  Index size_1;
  double dVar19;
  bool isValid;
  ostringstream errorMsg;
  ostringstream errorTag;
  char local_372;
  scalar_sum_op<double,_double> local_371;
  PointerType local_370;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_368;
  double local_358 [3];
  long *local_340 [2];
  long local_330 [2];
  undefined1 local_320 [16];
  variable_if_dynamic<long,__1> local_310;
  PointerType local_308;
  variable_if_dynamic<long,__1> local_300;
  variable_if_dynamic<long,__1> local_2f8;
  variable_if_dynamic<long,__1> local_2e8;
  variable_if_dynamic<long,__1> vStack_2e0;
  long local_2d8;
  PointerType local_2d0;
  variable_if_dynamic<long,__1> local_2c8;
  PointerType local_2b8;
  PointerType local_2b0 [2];
  variable_if_dynamic<long,__1> local_2a0;
  PointerType local_290;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
  local_1a8 [2];
  ios_base local_138 [264];
  
  local_370 = (PointerType)time;
  iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::resize((ulong)partialDerivative);
  if (this->m_valid == false) {
    iDynTree::VectorDynSize::zero();
LAB_00167043:
    bVar7 = true;
  }
  else {
    lVar9 = iDynTree::VectorDynSize::size();
    (*((this->selector).
       super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Selector[3])();
    lVar10 = iDynTree::MatrixDynSize::cols();
    if (lVar9 == lVar10) {
      peVar4 = (this->desiredTrajectory).
               super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar4->_vptr_TimeVaryingObject[2])(local_370,peVar4,&local_372);
      if (local_372 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"costFirstPartialDerivativeWRT",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(label->_M_dataplus)._M_p,label->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,"Unable to retrieve a valid desired ",0x23);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,(label->_M_dataplus)._M_p,label->_M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," at time: ",10);
        poVar16 = std::ostream::_M_insert<double>((double)local_370);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
        std::__cxx11::stringbuf::str();
        pdVar1 = local_368.m_storage.m_data;
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("L2NormCost",(char *)pdVar1,(char *)local_340[0]);
      }
      else {
        uVar8 = iDynTree::VectorDynSize::size();
        uVar11 = iDynTree::VectorDynSize::size();
        if (uVar11 == uVar8) {
          peVar5 = (this->selector).
                   super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar5->_vptr_Selector[2])(peVar5,values);
          lVar9 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          lVar10 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          uVar12 = iDynTree::VectorDynSize::data();
          uVar13 = iDynTree::VectorDynSize::size();
          uVar11 = uVar13;
          if (((uVar12 & 7) == 0) &&
             (uVar11 = (ulong)((uint)(uVar12 >> 3) & 1), (long)uVar13 <= (long)uVar11)) {
            uVar11 = uVar13;
          }
          lVar17 = uVar13 - uVar11;
          if (0 < (long)uVar11) {
            uVar18 = 0;
            do {
              *(double *)(uVar12 + uVar18 * 8) =
                   *(double *)(lVar9 + uVar18 * 8) - *(double *)(lVar10 + uVar18 * 8);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar18 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
          if (1 < lVar17) {
            do {
              pdVar1 = (double *)(lVar9 + uVar11 * 8);
              dVar19 = pdVar1[1];
              pdVar2 = (double *)(lVar10 + uVar11 * 8);
              dVar6 = pdVar2[1];
              pdVar3 = (double *)(uVar12 + uVar11 * 8);
              *pdVar3 = *pdVar1 - *pdVar2;
              pdVar3[1] = dVar19 - dVar6;
              uVar11 = uVar11 + 2;
            } while ((long)uVar11 < (long)uVar18);
          }
          if ((long)uVar18 < (long)uVar13) {
            do {
              *(double *)(uVar12 + uVar18 * 8) =
                   *(double *)(lVar9 + uVar18 * 8) - *(double *)(lVar10 + uVar18 * 8);
              uVar18 = uVar18 + 1;
            } while (uVar13 != uVar18);
          }
          local_370 = (PointerType)iDynTree::MatrixDynSize::data();
          lVar9 = iDynTree::MatrixDynSize::rows();
          lVar10 = iDynTree::MatrixDynSize::cols();
          pdVar14 = (PointerType)iDynTree::VectorDynSize::data();
          pdVar15 = (PointerType)iDynTree::VectorDynSize::size();
          uVar11 = iDynTree::VectorDynSize::data();
          uVar12 = iDynTree::VectorDynSize::size();
          local_368.m_storage.m_data = (double *)0x0;
          local_368.m_storage.m_rows = 0;
          local_310.m_value = lVar10;
          if (lVar9 == 0) {
LAB_00167360:
            local_340[0] = (long *)0x3ff0000000000000;
            local_320._0_8_ = local_370;
            local_320._8_8_ = lVar9;
            local_1a8[0].
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d._0_8_ = pdVar14;
            local_1a8[0].
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.lhsImpl.
            super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>_>
            .
            super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.
            super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>
            .
            super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true,_true>
            .
            super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
            .m_data = pdVar15;
            Eigen::internal::gemv_dense_selector<2,1,true>::
            run<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,_1,1,0,_1,1>>
                      ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                       local_320,
                       (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                       local_1a8,(Matrix<double,__1,_1,_0,__1,_1> *)&local_368,(Scalar *)local_340);
          }
          else {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_368,lVar9,1);
            if (0 < local_368.m_storage.m_rows) {
              memset(local_368.m_storage.m_data,0,local_368.m_storage.m_rows << 3);
            }
            local_340[0] = (long *)0x3ff0000000000000;
            if (lVar9 != 1) goto LAB_00167360;
            local_308 = local_370;
            local_300.m_value = 1;
            local_320._0_8_ = local_370;
            local_2e8.m_value = 0;
            vStack_2e0.m_value = 0;
            local_2a0.m_value = 0;
            local_2f8.m_value = lVar10;
            local_2d8 = lVar10;
            local_2d0 = pdVar14;
            local_2c8.m_value = (long)pdVar15;
            local_2b8 = pdVar14;
            local_2b0[0] = pdVar15;
            local_290 = pdVar15;
            if (pdVar15 == (PointerType)0x0) {
              dVar19 = 0.0;
            }
            else {
              local_1a8[0].
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.lhsImpl.
              super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>_>
              .
              super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
              .m_argImpl.
              super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>
              .
              super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true,_true>
              .
              super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
              .m_data = local_370;
              local_1a8[0].
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.lhsImpl.
              super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>_>
              .
              super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
              .m_argImpl.
              super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>
              .
              super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true,_true>
              .
              super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
              .m_outerStride.m_value = lVar10;
              local_1a8[0].
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.rhsImpl.
              super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
              .
              super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
              .
              super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              .m_data = pdVar14;
              local_1a8[0].
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.rhsImpl.
              super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
              .
              super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
              .
              super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              .m_outerStride.m_value = (long)pdVar15;
              dVar19 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>const,1,-1,true>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const,-1,1,true>const>>,3,0>
                       ::
                       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const,1,_1,true>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,_1,1,true>const>>
                                 (local_1a8,&local_371,
                                  (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
                                   *)local_320);
            }
            *local_368.m_storage.m_data = dVar19 + *local_368.m_storage.m_data;
          }
          uVar13 = uVar12;
          if (((uVar11 & 7) == 0) &&
             (uVar13 = (ulong)((uint)(uVar11 >> 3) & 1), (long)uVar12 <= (long)uVar13)) {
            uVar13 = uVar12;
          }
          lVar9 = uVar12 - uVar13;
          if (0 < (long)uVar13) {
            uVar18 = 0;
            do {
              *(double *)(uVar11 + uVar18 * 8) = local_368.m_storage.m_data[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar13 != uVar18);
          }
          uVar18 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
          if (1 < lVar9) {
            do {
              dVar19 = (local_368.m_storage.m_data + uVar13)[1];
              pdVar1 = (double *)(uVar11 + uVar13 * 8);
              *pdVar1 = local_368.m_storage.m_data[uVar13];
              pdVar1[1] = dVar19;
              uVar13 = uVar13 + 2;
            } while ((long)uVar13 < (long)uVar18);
          }
          if ((long)uVar18 < (long)uVar12) {
            do {
              *(double *)(uVar11 + uVar18 * 8) = local_368.m_storage.m_data[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar12 != uVar18);
          }
          free(local_368.m_storage.m_data);
          goto LAB_00167043;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"costFirstPartialDerivativeWRT",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(label->_M_dataplus)._M_p,label->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"The desired ",0xc);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,(label->_M_dataplus)._M_p,label->_M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," dimension does not match the size of the selector at time: ",0x3c);
        poVar16 = std::ostream::_M_insert<double>((double)local_370);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
        std::__cxx11::stringbuf::str();
        pdVar1 = local_368.m_storage.m_data;
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("L2NormCost",(char *)pdVar1,(char *)local_340[0]);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"costFirstPartialDerivativeWRT",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(label->_M_dataplus)._M_p,label->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"The ",4);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(label->_M_dataplus)._M_p,label->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16," dimension is not the one expected from the specified selector.",0x3f);
      std::__cxx11::stringbuf::str();
      pdVar1 = local_368.m_storage.m_data;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("L2NormCost",(char *)pdVar1,(char *)local_340[0]);
    }
    if (local_340[0] != local_330) {
      operator_delete(local_340[0],local_330[0] + 1);
    }
    if (local_368.m_storage.m_data != local_358) {
      operator_delete(local_368.m_storage.m_data,(long)local_358[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base((ios_base *)local_2b0);
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool evaluateGradient(double time, const VectorDynSize& values, VectorDynSize& partialDerivative, const std::string &label) {
                partialDerivative.resize(values.size());

                if (!isValid()) {
                    partialDerivative.zero();
                    return true;
                }

                if (values.size() != selector->asSelectorMatrix().cols()) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costFirstPartialDerivativeWRT" << label;
                    errorMsg << "The " << label <<" dimension is not the one expected from the specified selector.";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                bool isValid;
                const VectorDynSize& desired = desiredTrajectory->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costFirstPartialDerivativeWRT" << label;
                    errorMsg << "Unable to retrieve a valid desired " << label <<" at time: " << time << ".";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                if (selector->size() != desired.size()) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costFirstPartialDerivativeWRT" << label;;
                    errorMsg << "The desired " << label <<" dimension does not match the size of the selector at time: " << time << ".";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                iDynTree::toEigen(buffer) = iDynTree::toEigen(selector->select(values)) - iDynTree::toEigen(desired);
                iDynTree::toEigen(partialDerivative) = iDynTree::toEigen(gradientSubMatrix) * iDynTree::toEigen(buffer);

                return true;
            }